

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_mask_frame(ws_frame *frame)

{
  uint32_t uVar1;
  ulong local_20;
  size_t i;
  uint32_t r;
  ws_frame *frame_local;
  
  if ((frame->masked & 1U) == 0) {
    uVar1 = nni_random();
    frame->mask[0] = (uint8_t)(uVar1 >> 0x18);
    frame->mask[1] = (uint8_t)(uVar1 >> 0x10);
    frame->mask[2] = (uint8_t)(uVar1 >> 8);
    frame->mask[3] = (uint8_t)uVar1;
    for (local_20 = 0; local_20 < frame->len; local_20 = local_20 + 1) {
      frame->buf[local_20] = frame->buf[local_20] ^ frame->mask[local_20 & 3];
    }
    *(undefined4 *)(frame->head + frame->hlen) = *(undefined4 *)frame->mask;
    frame->hlen = frame->hlen + 4;
    frame->head[1] = frame->head[1] | 0x80;
    frame->masked = true;
  }
  return;
}

Assistant:

static void
ws_mask_frame(ws_frame *frame)
{
	uint32_t r;
	// frames sent by client need mask.
	if (frame->masked) {
		return;
	}
	r = nni_random();
	NNI_PUT32(frame->mask, r);
	for (size_t i = 0; i < frame->len; i++) {
		frame->buf[i] ^= frame->mask[i % 4];
	}
	memcpy(frame->head + frame->hlen, frame->mask, 4);
	frame->hlen += 4;
	frame->head[1] |= 0x80; // set masked bit
	frame->masked = true;
}